

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessage::CrossLinkPrototypes(DynamicMessage *this)

{
  DynamicMessageFactory *this_00;
  Descriptor *this_01;
  bool bVar1;
  int iVar2;
  CppType CVar3;
  LogMessage *other;
  FieldDescriptor *this_02;
  int *piVar4;
  undefined8 *puVar5;
  Descriptor *type;
  Message *pMVar6;
  void *field_ptr;
  FieldDescriptor *field;
  int i;
  Descriptor *descriptor;
  DynamicMessageFactory *factory;
  byte local_49;
  LogMessage local_48;
  DynamicMessage *local_10;
  DynamicMessage *this_local;
  
  local_10 = this;
  bVar1 = is_prototype(this);
  local_49 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/dynamic_message.cc"
               ,0x18c);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: is_prototype(): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&factory + 3),other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  this_00 = this->type_info_->factory;
  this_01 = this->type_info_->type;
  for (field._4_4_ = 0; iVar2 = Descriptor::field_count(this_01), field._4_4_ < iVar2;
      field._4_4_ = field._4_4_ + 1) {
    this_02 = Descriptor::field(this_01,field._4_4_);
    piVar4 = internal::scoped_array<int>::operator[](&this->type_info_->offsets,(long)field._4_4_);
    puVar5 = (undefined8 *)OffsetToPointer(this,*piVar4);
    CVar3 = FieldDescriptor::cpp_type(this_02);
    if ((CVar3 == CPPTYPE_MESSAGE) && (bVar1 = FieldDescriptor::is_repeated(this_02), !bVar1)) {
      type = FieldDescriptor::message_type(this_02);
      pMVar6 = DynamicMessageFactory::GetPrototypeNoLock(this_00,type);
      *puVar5 = pMVar6;
    }
  }
  return;
}

Assistant:

void DynamicMessage::CrossLinkPrototypes() {
  // This should only be called on the prototype message.
  GOOGLE_CHECK(is_prototype());

  DynamicMessageFactory* factory = type_info_->factory;
  const Descriptor* descriptor = type_info_->type;

  // Cross-link default messages.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !field->is_repeated()) {
      // For fields with message types, we need to cross-link with the
      // prototype for the field's type.
      // For singular fields, the field is just a pointer which should
      // point to the prototype.
      *reinterpret_cast<const Message**>(field_ptr) =
        factory->GetPrototypeNoLock(field->message_type());
    }
  }
}